

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O1

bool __thiscall HighsLp::equalButForScalingAndNames(HighsLp *this,HighsLp *lp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ObjSense OVar7;
  ObjSense OVar8;
  size_t __n;
  double *pdVar9;
  bool bVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  
  iVar3 = this->num_col_;
  iVar4 = this->num_row_;
  iVar5 = lp->num_col_;
  iVar6 = lp->num_row_;
  OVar7 = this->sense_;
  OVar8 = lp->sense_;
  dVar1 = this->offset_;
  dVar2 = lp->offset_;
  __n = (this->model_name_)._M_string_length;
  if (__n == (lp->model_name_)._M_string_length) {
    if (__n == 0) {
      bVar14 = true;
    }
    else {
      iVar11 = bcmp((this->model_name_)._M_dataplus._M_p,(lp->model_name_)._M_dataplus._M_p,__n);
      bVar14 = iVar11 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  pdVar12 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar12 ==
      (long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    bVar15 = pdVar12 == pdVar9;
    if (!bVar15) {
      if ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13))) {
        do {
          pdVar13 = pdVar13 + 1;
          pdVar12 = pdVar12 + 1;
          bVar15 = pdVar12 == pdVar9;
          if (bVar15) goto LAB_0023f6d3;
        } while ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13)));
      }
      goto LAB_0023f6d1;
    }
  }
  else {
LAB_0023f6d1:
    bVar15 = false;
  }
LAB_0023f6d3:
  pdVar12 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar12 ==
      (long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    bVar16 = pdVar12 == pdVar9;
    if (!bVar16) {
      if ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13))) {
        do {
          pdVar13 = pdVar13 + 1;
          pdVar12 = pdVar12 + 1;
          bVar16 = pdVar12 == pdVar9;
          if (bVar16) goto LAB_0023f72e;
        } while ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13)));
      }
      goto LAB_0023f72b;
    }
  }
  else {
LAB_0023f72b:
    bVar16 = false;
  }
LAB_0023f72e:
  pdVar12 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar12 ==
      (long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    bVar17 = pdVar12 == pdVar9;
    if (!bVar17) {
      if ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13))) {
        do {
          pdVar13 = pdVar13 + 1;
          pdVar12 = pdVar12 + 1;
          bVar17 = pdVar12 == pdVar9;
          if (bVar17) goto LAB_0023f788;
        } while ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13)));
      }
      goto LAB_0023f786;
    }
  }
  else {
LAB_0023f786:
    bVar17 = false;
  }
LAB_0023f788:
  pdVar12 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar12 ==
      (long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    bVar18 = pdVar12 == pdVar9;
    if (!bVar18) {
      if ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13))) {
        do {
          pdVar13 = pdVar13 + 1;
          pdVar12 = pdVar12 + 1;
          bVar18 = pdVar12 == pdVar9;
          if (bVar18) goto LAB_0023f7e4;
        } while ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13)));
      }
      goto LAB_0023f7e2;
    }
  }
  else {
LAB_0023f7e2:
    bVar18 = false;
  }
LAB_0023f7e4:
  pdVar12 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar12 ==
      (long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    bVar19 = pdVar12 == pdVar9;
    if (bVar19) goto LAB_0023f841;
    if ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13))) {
      do {
        pdVar13 = pdVar13 + 1;
        pdVar12 = pdVar12 + 1;
        bVar19 = pdVar12 == pdVar9;
        if (bVar19) goto LAB_0023f841;
      } while ((*pdVar12 == *pdVar13) && (!NAN(*pdVar12) && !NAN(*pdVar13)));
    }
  }
  bVar19 = false;
LAB_0023f841:
  bVar10 = HighsSparseMatrix::operator==(&this->a_matrix_,&lp->a_matrix_);
  return (bool)((bVar10 && ((iVar4 == iVar6 && OVar7 == OVar8) && iVar3 == iVar5)) &
               bVar16 & bVar17 & bVar14 & bVar15 & bVar18 & bVar19 & dVar1 == dVar2);
}

Assistant:

bool HighsLp::equalButForScalingAndNames(const HighsLp& lp) const {
  bool equal_vectors = true;
  equal_vectors = this->num_col_ == lp.num_col_ && equal_vectors;
  equal_vectors = this->num_row_ == lp.num_row_ && equal_vectors;
  equal_vectors = this->sense_ == lp.sense_ && equal_vectors;
  equal_vectors = this->offset_ == lp.offset_ && equal_vectors;
  equal_vectors = this->model_name_ == lp.model_name_ && equal_vectors;
  equal_vectors = this->col_cost_ == lp.col_cost_ && equal_vectors;
  equal_vectors = this->col_upper_ == lp.col_upper_ && equal_vectors;
  equal_vectors = this->col_lower_ == lp.col_lower_ && equal_vectors;
  equal_vectors = this->row_upper_ == lp.row_upper_ && equal_vectors;
  equal_vectors = this->row_lower_ == lp.row_lower_ && equal_vectors;
#ifndef NDEBUG
  if (!equal_vectors) printf("HighsLp::equalButForNames: Unequal vectors\n");
#endif
  const bool equal_matrix = this->a_matrix_ == lp.a_matrix_;
#ifndef NDEBUG
  if (!equal_matrix) printf("HighsLp::equalButForNames: Unequal matrix\n");
#endif
  return equal_vectors && equal_matrix;
}